

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O3

llama_batch * llama_batch_get_one(llama_token *tokens,int32_t n_tokens)

{
  llama_batch *in_RDI;
  
  *(undefined8 *)in_RDI = 0;
  in_RDI->token = (llama_token *)0x0;
  in_RDI->n_seq_id = (int32_t *)0x0;
  in_RDI->seq_id = (llama_seq_id **)0x0;
  in_RDI->embd = (float *)0x0;
  in_RDI->pos = (llama_pos *)0x0;
  in_RDI->logits = (int8_t *)0x0;
  in_RDI->n_tokens = n_tokens;
  in_RDI->token = tokens;
  return in_RDI;
}

Assistant:

struct llama_batch llama_batch_get_one(
             llama_token * tokens,
                 int32_t   n_tokens) {
    return {
        /*n_tokens       =*/ n_tokens,
        /*tokens         =*/ tokens,
        /*embd           =*/ nullptr,
        /*pos            =*/ nullptr,
        /*n_seq_id       =*/ nullptr,
        /*seq_id         =*/ nullptr,
        /*logits         =*/ nullptr,
    };
}